

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

int Acb_ObjFindFanoutPushableIndex(Acb_Ntk_t *p,int iObj)

{
  int iVar1;
  int *piVar2;
  word t;
  int *pFanins;
  int local_20;
  int iFanin;
  int k;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  local_20 = 0;
  piVar2 = Acb_ObjFanins(p,iObj);
  while( true ) {
    if (*piVar2 <= local_20) {
      return -1;
    }
    t = Acb_ObjTruth(p,iObj);
    iVar1 = Abc_Tt6CheckOutDec(t,local_20,(word *)0x0);
    if (-1 < iVar1) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

static inline int Acb_ObjFindFanoutPushableIndex( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins;
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        if ( Abc_Tt6CheckOutDec(Acb_ObjTruth(p, iObj), k, NULL) >= 0 )
            return k;
    return -1;
}